

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

void __thiscall xray_re::xr_mesh_builder::remove_duplicate_faces(xr_mesh_builder *this)

{
  bool bVar1;
  uint uVar2;
  pointer pbVar3;
  reference pvVar4;
  reference pvVar5;
  reference pbVar6;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_68;
  const_iterator local_60;
  b_face *local_50;
  b_face *local_48;
  __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
  local_40;
  const_iterator local_38;
  reference local_30;
  b_face *face;
  uint_fast32_t next;
  b_face_vec_it end;
  b_face_vec_it it;
  xr_mesh_builder *this_local;
  
  generate_vertex_faces(this);
  end._M_current =
       (b_face *)
       std::
       vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
       begin(&this->m_faces);
  next = (uint_fast32_t)
         std::
         vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
         ::end(&this->m_faces);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                             *)&next);
    if (!bVar1) {
      local_48 = (b_face *)
                 std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::begin(&this->m_faces);
      local_50 = (b_face *)
                 std::
                 vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                 ::end(&this->m_faces);
      local_40 = std::
                 remove_if<__gnu_cxx::__normal_iterator<xray_re::xr_mesh_builder::b_face*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>,bad_face_pred>
                           (local_48,local_50);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
      ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
                ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
                  *)&local_38,&local_40);
      local_68._M_current =
           (b_face *)
           std::
           vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
           ::end(&this->m_faces);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
      ::__normal_iterator<xray_re::xr_mesh_builder::b_face*>
                ((__normal_iterator<xray_re::xr_mesh_builder::b_face_const*,std::vector<xray_re::xr_mesh_builder::b_face,std::allocator<xray_re::xr_mesh_builder::b_face>>>
                  *)&local_60,&local_68);
      std::
      vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>::
      erase(&this->m_faces,local_38,local_60);
      return;
    }
    pbVar3 = __gnu_cxx::
             __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
             ::operator->(&end);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_vertex_faces,(ulong)(pbVar3->field_0).field_0.v[0]);
    uVar2 = *pvVar4;
    while (face = (b_face *)(ulong)uVar2, face != (b_face *)0xffffffff) {
      pvVar5 = std::
               vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
               ::operator[](&this->m_faces,(size_type)face);
      local_30 = pvVar5;
      pbVar6 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator*(&end);
      if (pbVar6 < pvVar5) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                 ::operator->(&end);
        bVar1 = b_face::is_duplicate(pbVar3,local_30);
        if (bVar1) {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
                   ::operator->(&end);
          (pbVar3->field_1).field_1.surf_idx = 0xffffffff;
          break;
        }
      }
      pvVar5 = local_30;
      pbVar3 = __gnu_cxx::
               __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
               ::operator->(&end);
      uVar2 = b_face::next_face_idx(pvVar5,(ulong)(pbVar3->field_0).field_0.v[0]);
    }
    __gnu_cxx::
    __normal_iterator<xray_re::xr_mesh_builder::b_face_*,_std::vector<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>_>
    ::operator++(&end);
  } while( true );
}

Assistant:

void xr_mesh_builder::remove_duplicate_faces()
{
	generate_vertex_faces();
	for (b_face_vec_it it = m_faces.begin(), end = m_faces.end(); it != end; ++it) {
		for (uint_fast32_t next = m_vertex_faces[it->v0]; next != BAD_IDX;) {
			b_face* face = &m_faces[next];
			if (face > &*it && it->is_duplicate(*face)) {
				it->surf_idx = BAD_IDX;
				goto skip;
			}
			next = face->next_face_idx(it->v0);
		}
skip:;
	}
	m_faces.erase(std::remove_if(m_faces.begin(), m_faces.end(), bad_face_pred()), m_faces.end());
}